

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallSubdirectoryGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallSubdirectoryGenerator::GenerateScript(cmInstallSubdirectoryGenerator *this,ostream *os)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  pointer pcVar2;
  bool bVar3;
  PolicyStatus PVar4;
  ostream *poVar5;
  int iVar6;
  string odir;
  string local_48;
  
  this_00 = this->Makefile;
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"EXCLUDE_FROM_ALL","");
  bVar3 = cmMakefile::GetPropertyAsBool(this_00,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    PVar4 = cmLocalGenerator::GetPolicyStatus(this->LocalGenerator,CMP0082);
    if (PVar4 - NEW < 3) {
      pcVar2 = (this->BinaryDirectory)._M_dataplus._M_p;
      local_48._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,pcVar2,pcVar2 + (this->BinaryDirectory)._M_string_length);
      cmsys::SystemTools::ConvertToUnixSlashes(&local_48);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,"if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n",0x21);
      iVar6 = 2;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,"# Include the install script for the subdirectory.\n",0x33);
      iVar6 = 2;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
      std::__ostream_insert<char,std::char_traits<char>>(os,"include(\"",9);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_48._M_dataplus._M_p,local_48._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/cmake_install.cmake\")\n",0x17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"endif()\n\n",9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void cmInstallSubdirectoryGenerator::GenerateScript(std::ostream& os)
{
  if (!this->Makefile->GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
    cmPolicies::PolicyStatus status =
      this->LocalGenerator->GetPolicyStatus(cmPolicies::CMP0082);
    switch (status) {
      case cmPolicies::WARN:
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is handled in cmLocalGenerator::GenerateInstallRules()
        break;

      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS: {
        Indent indent;
        std::string odir = this->BinaryDirectory;
        cmSystemTools::ConvertToUnixSlashes(odir);
        os << indent << "if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n"
           << indent.Next()
           << "# Include the install script for the subdirectory.\n"
           << indent.Next() << "include(\"" << odir
           << "/cmake_install.cmake\")\n"
           << indent << "endif()\n\n";
      } break;
    }
  }
}